

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

Int64Set * __thiscall
google::protobuf::Arena::DoCreateMessage<CoreML::Specification::Int64Set>(Arena *this)

{
  Int64Set *this_00;
  
  this_00 = (Int64Set *)
            AllocateAlignedWithHook
                      (this,0x28,(type_info *)&CoreML::Specification::Int64Set::typeinfo);
  CoreML::Specification::Int64Set::Int64Set(this_00,this,false);
  return this_00;
}

Assistant:

PROTOBUF_NDEBUG_INLINE T* DoCreateMessage(Args&&... args) {
    return InternalHelper<T>::Construct(
        AllocateInternal(sizeof(T), alignof(T),
                         internal::ObjectDestructor<
                             InternalHelper<T>::is_destructor_skippable::value,
                             T>::destructor,
                         RTTI_TYPE_ID(T)),
        this, std::forward<Args>(args)...);
  }